

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::rc::Texture3D::sample4(Texture3D *this,Vec4 *output,Vec3 *packetTexcoords,float lodBias)

{
  float fVar1;
  undefined8 uVar2;
  ConstPixelBufferAccess *pCVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int i;
  long lVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  ulong uVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar21;
  undefined1 auVar20 [16];
  float fVar22;
  undefined1 auVar23 [16];
  float fVar24;
  Vec3 dFdy1;
  Vec3 dFdy0;
  Vec3 dFdx1;
  Vec3 dFdx0;
  float local_98 [4];
  float local_88 [4];
  float local_78 [4];
  float local_68 [4];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_40;
  undefined8 uStack_38;
  
  if ((this->m_view).m_numLevels < 1) {
    local_58 = 0;
    fVar16 = 0.0;
  }
  else {
    pCVar3 = (this->m_view).m_levels;
    uVar2 = *(undefined8 *)(pCVar3->m_size).m_data;
    local_58 = CONCAT44((float)(int)((ulong)uVar2 >> 0x20),(float)(int)uVar2);
    fVar16 = (float)(pCVar3->m_size).m_data[2];
  }
  uStack_50 = 0;
  local_68[2] = 0.0;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  lVar8 = 0;
  do {
    local_68[lVar8] = packetTexcoords[1].m_data[lVar8] - packetTexcoords->m_data[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  local_78[2] = 0.0;
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  lVar8 = 0;
  do {
    local_78[lVar8] = packetTexcoords[3].m_data[lVar8] - packetTexcoords[2].m_data[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  local_88[2] = 0.0;
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  lVar8 = 0;
  do {
    local_88[lVar8] = packetTexcoords[2].m_data[lVar8] - packetTexcoords->m_data[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  local_98[2] = 0.0;
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  lVar8 = 0;
  do {
    local_98[lVar8] = packetTexcoords[3].m_data[lVar8] - packetTexcoords[1].m_data[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  fVar7 = local_68[0];
  fVar6 = local_78[0];
  fVar5 = local_88[0];
  fVar4 = local_98[0];
  pfVar11 = packetTexcoords->m_data + 2;
  uVar12 = 0;
  do {
    fVar19 = fVar7;
    if (1 < uVar12) {
      fVar19 = fVar6;
    }
    pfVar9 = local_78;
    if (1 >= uVar12) {
      pfVar9 = local_68;
    }
    bVar13 = (uVar12 & 1) != 0;
    fVar21 = fVar5;
    if (bVar13) {
      fVar21 = fVar4;
    }
    pfVar10 = local_98;
    if (!bVar13) {
      pfVar10 = local_88;
    }
    fVar1 = pfVar9[2];
    fVar22 = -fVar1;
    if (-fVar1 <= fVar1) {
      fVar22 = fVar1;
    }
    fVar1 = pfVar10[2];
    fVar24 = -fVar1;
    if (-fVar1 <= fVar1) {
      fVar24 = fVar1;
    }
    auVar18._4_4_ = pfVar9[1];
    auVar18._0_4_ = fVar19;
    auVar18._8_8_ = 0;
    auVar23._0_8_ = CONCAT44(pfVar9[1],fVar19) ^ 0x8000000080000000;
    auVar23._8_4_ = 0x80000000;
    auVar23._12_4_ = 0x80000000;
    auVar23 = maxps(auVar23,auVar18);
    auVar20._4_4_ = pfVar10[1];
    auVar20._0_4_ = fVar21;
    auVar20._8_8_ = 0;
    auVar17._0_8_ = CONCAT44(pfVar10[1],fVar21) ^ 0x8000000080000000;
    auVar17._8_4_ = 0x80000000;
    auVar17._12_4_ = 0x80000000;
    auVar18 = maxps(auVar17,auVar20);
    uVar14 = -(uint)(auVar18._0_4_ <= auVar23._0_4_);
    uVar15 = -(uint)(auVar18._4_4_ <= auVar23._4_4_);
    fVar19 = (float)(~uVar14 & (uint)auVar18._0_4_ | (uint)auVar23._0_4_ & uVar14) * (float)local_58
    ;
    fVar21 = (float)(~uVar15 & (uint)auVar18._4_4_ | (uint)auVar23._4_4_ & uVar15) * local_58._4_4_;
    uVar14 = -(uint)(fVar21 <= fVar19);
    fVar21 = (float)(~uVar14 & (uint)fVar21 | (uint)fVar19 & uVar14);
    fVar19 = (float)(~-(uint)(fVar24 <= fVar22) & (uint)fVar24 |
                    (uint)fVar22 & -(uint)(fVar24 <= fVar22)) * fVar16;
    uVar14 = -(uint)(fVar19 <= fVar21);
    fVar19 = logf((float)(~uVar14 & (uint)fVar19 | uVar14 & (uint)fVar21));
    tcu::sampleLevelArray3D
              ((tcu *)&local_40,(this->m_view).m_levels,(this->m_view).m_numLevels,
               &(this->super_Texture).m_sampler,((Vec3 *)(pfVar11 + -2))->m_data[0],pfVar11[-1],
               *pfVar11,fVar19 * 1.442695 + lodBias);
    *(undefined8 *)output->m_data = local_40;
    *(undefined8 *)(output->m_data + 2) = uStack_38;
    uVar12 = uVar12 + 1;
    output = output + 1;
    pfVar11 = pfVar11 + 3;
  } while (uVar12 != 4);
  return;
}

Assistant:

void Texture3D::sample4 (tcu::Vec4 output[4], const tcu::Vec3 packetTexcoords[4], float lodBias) const
{
	const float texWidth  = (float)m_view.getWidth();
	const float texHeight = (float)m_view.getHeight();
	const float texDepth  = (float)m_view.getDepth();

	const tcu::Vec3 dFdx0 = packetTexcoords[1] - packetTexcoords[0];
	const tcu::Vec3 dFdx1 = packetTexcoords[3] - packetTexcoords[2];
	const tcu::Vec3 dFdy0 = packetTexcoords[2] - packetTexcoords[0];
	const tcu::Vec3 dFdy1 = packetTexcoords[3] - packetTexcoords[1];

	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::Vec3& dFdx = (fragNdx & 2) ? dFdx1 : dFdx0;
		const tcu::Vec3& dFdy = (fragNdx & 1) ? dFdy1 : dFdy0;

		const float mu = de::max(de::abs(dFdx.x()), de::abs(dFdy.x()));
		const float mv = de::max(de::abs(dFdx.y()), de::abs(dFdy.y()));
		const float mw = de::max(de::abs(dFdx.z()), de::abs(dFdy.z()));
		const float p = de::max(de::max(mu * texWidth, mv * texHeight), mw * texDepth);

		const float	lod = deFloatLog2(p) + lodBias;

		output[fragNdx] = sample(packetTexcoords[fragNdx].x(), packetTexcoords[fragNdx].y(), packetTexcoords[fragNdx].z(), lod);
	}
}